

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PopLoopBlock(cmMakefile *this)

{
  int *piVar1;
  _Elt_pointer piVar2;
  int iVar3;
  
  piVar2 = (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar2 == (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    __assert_fail("!this->LoopBlockCounter.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                  ,0xc3e,"void cmMakefile::PopLoopBlock()");
  }
  if (piVar2 == (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar1 = (this->LoopBlockCounter).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1];
    iVar3 = piVar1[0x7f];
    if (0 < iVar3) {
      piVar2 = piVar1 + 0x80;
      goto LAB_001a318a;
    }
  }
  else {
    iVar3 = piVar2[-1];
    if (0 < iVar3) {
LAB_001a318a:
      piVar2[-1] = iVar3 + -1;
      return;
    }
  }
  __assert_fail("this->LoopBlockCounter.top() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                ,0xc3f,"void cmMakefile::PopLoopBlock()");
}

Assistant:

void cmMakefile::PopLoopBlock()
{
  assert(!this->LoopBlockCounter.empty());
  assert(this->LoopBlockCounter.top() > 0);
  this->LoopBlockCounter.top()--;
}